

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void ARGBExtractAlphaRow_AVX2(uint8_t *src_argb,uint8_t *dst_a,int width)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  bool bVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  lvec32 aiVar7;
  int iVar8;
  undefined1 auVar9 [32];
  int width_local;
  
  aiVar7 = libyuv::kPermdARGBToY_AVX;
  auVar9._16_16_ = (undefined1  [16])libyuv::kShuffleAlphaShort_AVX2;
  auVar9._0_16_ = (undefined1  [16])libyuv::kShuffleAlphaShort_AVX2;
  do {
    auVar4 = vpshufb_avx2(*(undefined1 (*) [32])src_argb,auVar9);
    auVar5 = vpshufb_avx2(*(undefined1 (*) [32])((long)src_argb + 0x20),auVar9);
    pauVar1 = (undefined1 (*) [32])((long)src_argb + 0x40);
    pauVar2 = (undefined1 (*) [32])((long)src_argb + 0x60);
    src_argb = (uint8_t *)((long)src_argb + 0x80);
    auVar4 = vpackssdw_avx2(auVar4,auVar5);
    auVar5 = vpshufb_avx2(*pauVar1,auVar9);
    auVar6 = vpshufb_avx2(*pauVar2,auVar9);
    auVar5 = vpackssdw_avx2(auVar5,auVar6);
    auVar4 = vpackuswb_avx2(auVar4,auVar5);
    auVar4 = vpermd_avx2((undefined1  [32])aiVar7,auVar4);
    *(undefined1 (*) [32])dst_a = auVar4;
    dst_a = (uint8_t *)((long)dst_a + 0x20);
    iVar8 = width + -0x20;
    bVar3 = 0x1f < width;
    width = iVar8;
  } while (iVar8 != 0 && bVar3);
  return;
}

Assistant:

void ARGBExtractAlphaRow_AVX2(const uint8_t* src_argb,
                              uint8_t* dst_a,
                              int width) {
  asm volatile(
      "vmovdqa     %3,%%ymm4                     \n"
      "vbroadcastf128 %4,%%ymm5                  \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0), %%ymm0                  \n"
      "vmovdqu     0x20(%0), %%ymm1              \n"
      "vpshufb     %%ymm5,%%ymm0,%%ymm0          \n"  // vpsrld $0x18, %%ymm0
      "vpshufb     %%ymm5,%%ymm1,%%ymm1          \n"
      "vmovdqu     0x40(%0), %%ymm2              \n"
      "vmovdqu     0x60(%0), %%ymm3              \n"
      "lea         0x80(%0), %0                  \n"
      "vpackssdw   %%ymm1, %%ymm0, %%ymm0        \n"  // mutates
      "vpshufb     %%ymm5,%%ymm2,%%ymm2          \n"
      "vpshufb     %%ymm5,%%ymm3,%%ymm3          \n"
      "vpackssdw   %%ymm3, %%ymm2, %%ymm2        \n"  // mutates
      "vpackuswb   %%ymm2,%%ymm0,%%ymm0          \n"  // mutates.
      "vpermd      %%ymm0,%%ymm4,%%ymm0          \n"  // unmutate.
      "vmovdqu     %%ymm0,(%1)                   \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x20, %2                     \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_argb),               // %0
        "+r"(dst_a),                  // %1
        "+rm"(width)                  // %2
      : "m"(kPermdARGBToY_AVX),       // %3
        "m"(kShuffleAlphaShort_AVX2)  // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}